

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

vm_httpreq_ext * vm_httpreq_ext::alloc_ext(CVmObjHTTPRequest *self)

{
  int iVar1;
  CVmVarHeap *pCVar2;
  undefined4 extraout_var;
  undefined8 in_RDI;
  vm_httpreq_ext *ext;
  size_t siz;
  vm_httpreq_ext *pvVar3;
  
  pCVar2 = CVmMemory::get_var_heap(G_mem_X);
  iVar1 = (*pCVar2->_vptr_CVmVarHeap[4])(pCVar2,0x18,in_RDI);
  pvVar3 = (vm_httpreq_ext *)CONCAT44(extraout_var,iVar1);
  pvVar3->req = (TadsHttpRequest *)0x0;
  pvVar3->cookies = (vm_httpreq_cookie *)0x0;
  return pvVar3;
}

Assistant:

vm_httpreq_ext *vm_httpreq_ext::alloc_ext(VMG_ CVmObjHTTPRequest *self)
{
    /* calculate how much space we need */
    size_t siz = sizeof(vm_httpreq_ext);

    /* allocate the memory */
    vm_httpreq_ext *ext = (vm_httpreq_ext *)G_mem->get_var_heap()->alloc_mem(
        siz, self);

    /* we don't have a system message object yet */
    ext->req = 0;

    /* we have no reply cookies yet */
    ext->cookies = 0;

    /* return the new extension */
    return ext;
}